

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.cc
# Opt level: O1

bool __thiscall
dtc::fdt::checking::check_manager::run_checks(check_manager *this,device_tree *tree,bool keep_going)

{
  bool bVar1;
  bool bVar2;
  _Hash_node_base *p_Var3;
  
  p_Var3 = (this->checkers)._M_h._M_before_begin._M_nxt;
  if (p_Var3 == (_Hash_node_base *)0x0) {
    bVar2 = true;
  }
  else {
    bVar2 = true;
    do {
      bVar1 = checker::visit_node((checker *)p_Var3[5]._M_nxt,tree,&tree->root);
      bVar2 = (bool)(bVar1 & bVar2);
      if (bVar2 == false && !keep_going) {
        return bVar2;
      }
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  return bVar2;
}

Assistant:

bool
check_manager::run_checks(device_tree *tree, bool keep_going)
{
	bool success = true;
	for (auto &i : checkers)
	{
		success &= i.second->check_tree(tree);
		if (!(success || keep_going))
		{
			break;
		}
	}
	return success;
}